

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

QByteArray * __thiscall QRingChunk::toByteArray(QByteArray *__return_storage_ptr__,QRingChunk *this)

{
  long lVar1;
  Data *pDVar2;
  qsizetype qVar3;
  char *pcVar4;
  
  lVar1 = this->headOffset;
  if ((lVar1 != 0) || (this->tailOffset != (this->chunk).d.size)) {
    pDVar2 = (this->chunk).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)
       ) {
      QByteArray::QByteArray
                (__return_storage_ptr__,(this->chunk).d.ptr + lVar1,this->tailOffset - lVar1);
      return __return_storage_ptr__;
    }
    QByteArray::resize(&this->chunk,this->tailOffset);
    QByteArray::remove(&this->chunk,(char *)0x0);
  }
  pDVar2 = (this->chunk).d.d;
  pcVar4 = (this->chunk).d.ptr;
  (this->chunk).d.d = (Data *)0x0;
  (this->chunk).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pcVar4;
  qVar3 = (this->chunk).d.size;
  (this->chunk).d.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QRingChunk::toByteArray() &&
{
    // ### Replace with std::move(chunk).sliced(head(), size()) once sliced()&& is available
    if (headOffset != 0 || tailOffset != chunk.size()) {
        if (isShared())
            return chunk.sliced(head(), size());

        chunk.resize(tailOffset);
        chunk.remove(0, headOffset);
    }

    return std::move(chunk);
}